

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void read_debug_pred_weight_table(h264_stream_t *h,bs_t *b)

{
  slice_header_t *psVar1;
  sps_t *psVar2;
  pps_t *ppVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  FILE *pFVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  
  pFVar12 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar12 = _stdout;
  }
  psVar1 = h->sh;
  psVar2 = h->sps;
  ppVar3 = h->pps;
  iVar9 = 0;
  fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  pbVar5 = b->p;
  pbVar4 = b->end;
  uVar10 = b->bits_left;
  uVar6 = 0xffffffff;
  do {
    uVar10 = uVar10 - 1;
    b->bits_left = uVar10;
    bVar18 = true;
    if (pbVar5 < pbVar4) {
      bVar18 = (*pbVar5 >> (uVar10 & 0x1f) & 1) == 0;
    }
    if (uVar10 == 0) {
      pbVar5 = pbVar5 + 1;
      b->p = pbVar5;
      b->bits_left = 8;
      uVar10 = 8;
    }
    uVar6 = uVar6 + 1;
    iVar9 = iVar9 + -1;
  } while (((bool)(bVar18 & uVar6 < 0x20)) && (pbVar5 < pbVar4));
  if (iVar9 == -1) {
    uVar10 = 0;
  }
  else {
    iVar7 = -2 - iVar9;
    iVar11 = -3 - iVar9;
    uVar6 = b->bits_left;
    pbVar5 = b->p;
    uVar10 = 0;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      uVar8 = 0;
      if (pbVar5 < pbVar4) {
        uVar8 = (uint)((*pbVar5 >> (uVar6 & 0x1f) & 1) != 0);
      }
      if (uVar6 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar10 = uVar10 | uVar8 << ((byte)iVar7 & 0x1f);
      iVar11 = iVar11 + -1;
      iVar7 = iVar7 + -1;
    } while (iVar11 != -2);
  }
  (psVar1->pwt).luma_log2_weight_denom = ~(-1 << (~(byte)iVar9 & 0x1f)) + uVar10;
  pFVar12 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar12 = _stdout;
  }
  fprintf(pFVar12,"sh->pwt.luma_log2_weight_denom: %d \n");
  if (psVar2->chroma_format_idc != 0) {
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    iVar9 = 0;
    fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
    pbVar5 = b->p;
    pbVar4 = b->end;
    uVar10 = b->bits_left;
    uVar6 = 0xffffffff;
    do {
      uVar10 = uVar10 - 1;
      b->bits_left = uVar10;
      bVar18 = true;
      if (pbVar5 < pbVar4) {
        bVar18 = (*pbVar5 >> (uVar10 & 0x1f) & 1) == 0;
      }
      if (uVar10 == 0) {
        pbVar5 = pbVar5 + 1;
        b->p = pbVar5;
        b->bits_left = 8;
        uVar10 = 8;
      }
      uVar6 = uVar6 + 1;
      iVar9 = iVar9 + -1;
    } while (((bool)(bVar18 & uVar6 < 0x20)) && (pbVar5 < pbVar4));
    if (iVar9 == -1) {
      uVar10 = 0;
    }
    else {
      iVar7 = -2 - iVar9;
      iVar11 = -3 - iVar9;
      uVar6 = b->bits_left;
      pbVar5 = b->p;
      uVar10 = 0;
      do {
        uVar6 = uVar6 - 1;
        b->bits_left = uVar6;
        uVar8 = 0;
        if (pbVar5 < pbVar4) {
          uVar8 = (uint)((*pbVar5 >> (uVar6 & 0x1f) & 1) != 0);
        }
        if (uVar6 == 0) {
          pbVar5 = pbVar5 + 1;
          b->p = pbVar5;
          b->bits_left = 8;
          uVar6 = 8;
        }
        uVar10 = uVar10 | uVar8 << ((byte)iVar7 & 0x1f);
        iVar11 = iVar11 + -1;
        iVar7 = iVar7 + -1;
      } while (iVar11 != -2);
    }
    (psVar1->pwt).chroma_log2_weight_denom = ~(-1 << (~(byte)iVar9 & 0x1f)) + uVar10;
    pFVar12 = (FILE *)h264_dbgfile;
    if (h264_dbgfile == (FILE *)0x0) {
      pFVar12 = _stdout;
    }
    fprintf(pFVar12,"sh->pwt.chroma_log2_weight_denom: %d \n");
  }
  if (-1 < ppVar3->num_ref_idx_l0_active_minus1) {
    lVar16 = 0;
    do {
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      uVar15 = 0;
      fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar10 = b->bits_left - 1;
      b->bits_left = uVar10;
      pbVar5 = b->p;
      if (pbVar5 < b->end) {
        uVar15 = (ulong)((*pbVar5 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        b->p = pbVar5 + 1;
        b->bits_left = 8;
      }
      (psVar1->pwt).luma_weight_l0_flag[lVar16] = (int)uVar15;
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      fprintf(pFVar12,"sh->pwt.luma_weight_l0_flag[i]: %d \n",uVar15);
      if ((psVar1->pwt).luma_weight_l0_flag[lVar16] != 0) {
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        pbVar5 = b->p;
        pbVar4 = b->end;
        uVar10 = b->bits_left;
        uVar6 = 0xffffffff;
        iVar9 = -2;
        do {
          iVar7 = iVar9;
          uVar8 = uVar6;
          uVar10 = uVar10 - 1;
          b->bits_left = uVar10;
          bVar18 = true;
          if (pbVar5 < pbVar4) {
            bVar18 = (*pbVar5 >> (uVar10 & 0x1f) & 1) == 0;
          }
          if (uVar10 == 0) {
            pbVar5 = pbVar5 + 1;
            b->p = pbVar5;
            b->bits_left = 8;
            uVar10 = 8;
          }
          uVar6 = uVar8 + 1;
        } while (((bool)(bVar18 & uVar6 < 0x20)) && (iVar9 = iVar7 + 1, pbVar5 < pbVar4));
        if (uVar6 == 0) {
          uVar10 = 0;
        }
        else {
          uVar13 = b->bits_left;
          pbVar5 = b->p;
          uVar10 = 0;
          do {
            uVar13 = uVar13 - 1;
            b->bits_left = uVar13;
            uVar14 = 0;
            if (pbVar5 < pbVar4) {
              uVar14 = (uint)((*pbVar5 >> (uVar13 & 0x1f) & 1) != 0);
            }
            if (uVar13 == 0) {
              pbVar5 = pbVar5 + 1;
              b->p = pbVar5;
              b->bits_left = 8;
              uVar13 = 8;
            }
            uVar10 = uVar10 | uVar14 << ((byte)uVar8 & 0x1f);
            uVar8 = uVar8 - 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != -2);
        }
        uVar8 = -1 << ((byte)uVar6 & 0x1f);
        uVar6 = ~uVar8 + uVar10;
        iVar9 = -((int)uVar6 >> 1);
        if ((uVar6 & 1) != 0) {
          iVar9 = (int)(uVar10 - uVar8) >> 1;
        }
        (psVar1->pwt).luma_weight_l0[lVar16] = iVar9;
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"sh->pwt.luma_weight_l0[ i ]: %d \n");
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        pbVar5 = b->p;
        pbVar4 = b->end;
        uVar10 = b->bits_left;
        uVar6 = 0xffffffff;
        iVar9 = -2;
        do {
          iVar7 = iVar9;
          uVar8 = uVar6;
          uVar10 = uVar10 - 1;
          b->bits_left = uVar10;
          bVar18 = true;
          if (pbVar5 < pbVar4) {
            bVar18 = (*pbVar5 >> (uVar10 & 0x1f) & 1) == 0;
          }
          if (uVar10 == 0) {
            pbVar5 = pbVar5 + 1;
            b->p = pbVar5;
            b->bits_left = 8;
            uVar10 = 8;
          }
          uVar6 = uVar8 + 1;
        } while (((bool)(bVar18 & uVar6 < 0x20)) && (iVar9 = iVar7 + 1, pbVar5 < pbVar4));
        if (uVar6 == 0) {
          uVar10 = 0;
        }
        else {
          uVar13 = b->bits_left;
          pbVar5 = b->p;
          uVar10 = 0;
          do {
            uVar13 = uVar13 - 1;
            b->bits_left = uVar13;
            uVar14 = 0;
            if (pbVar5 < pbVar4) {
              uVar14 = (uint)((*pbVar5 >> (uVar13 & 0x1f) & 1) != 0);
            }
            if (uVar13 == 0) {
              pbVar5 = pbVar5 + 1;
              b->p = pbVar5;
              b->bits_left = 8;
              uVar13 = 8;
            }
            uVar10 = uVar10 | uVar14 << ((byte)uVar8 & 0x1f);
            uVar8 = uVar8 - 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != -2);
        }
        uVar6 = -1 << ((byte)uVar6 & 0x1f);
        uVar8 = ~uVar6 + uVar10;
        iVar9 = -((int)uVar8 >> 1);
        if ((uVar8 & 1) != 0) {
          iVar9 = (int)(uVar10 - uVar6) >> 1;
        }
        (psVar1->pwt).luma_offset_l0[lVar16] = iVar9;
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"sh->pwt.luma_offset_l0[ i ]: %d \n");
      }
      if (psVar2->chroma_format_idc != 0) {
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        uVar15 = 0;
        fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar10 = b->bits_left - 1;
        b->bits_left = uVar10;
        pbVar5 = b->p;
        if (pbVar5 < b->end) {
          uVar15 = (ulong)((*pbVar5 >> (uVar10 & 0x1f) & 1) != 0);
        }
        if (uVar10 == 0) {
          b->p = pbVar5 + 1;
          b->bits_left = 8;
        }
        (psVar1->pwt).chroma_weight_l0_flag[lVar16] = (int)uVar15;
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"sh->pwt.chroma_weight_l0_flag[i]: %d \n",uVar15);
        if ((psVar1->pwt).chroma_weight_l0_flag[lVar16] != 0) {
          lVar17 = 0;
          do {
            pFVar12 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar12 = _stdout;
            }
            fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
            pbVar5 = b->p;
            pbVar4 = b->end;
            uVar10 = b->bits_left;
            uVar6 = 0xffffffff;
            iVar9 = -2;
            do {
              iVar7 = iVar9;
              uVar8 = uVar6;
              uVar10 = uVar10 - 1;
              b->bits_left = uVar10;
              bVar18 = true;
              if (pbVar5 < pbVar4) {
                bVar18 = (*pbVar5 >> (uVar10 & 0x1f) & 1) == 0;
              }
              if (uVar10 == 0) {
                pbVar5 = pbVar5 + 1;
                b->p = pbVar5;
                b->bits_left = 8;
                uVar10 = 8;
              }
              uVar6 = uVar8 + 1;
            } while (((bool)(bVar18 & uVar6 < 0x20)) && (iVar9 = iVar7 + 1, pbVar5 < pbVar4));
            if (uVar6 == 0) {
              uVar10 = 0;
            }
            else {
              uVar13 = b->bits_left;
              pbVar5 = b->p;
              uVar10 = 0;
              do {
                uVar13 = uVar13 - 1;
                b->bits_left = uVar13;
                uVar14 = 0;
                if (pbVar5 < pbVar4) {
                  uVar14 = (uint)((*pbVar5 >> (uVar13 & 0x1f) & 1) != 0);
                }
                if (uVar13 == 0) {
                  pbVar5 = pbVar5 + 1;
                  b->p = pbVar5;
                  b->bits_left = 8;
                  uVar13 = 8;
                }
                uVar10 = uVar10 | uVar14 << ((byte)uVar8 & 0x1f);
                uVar8 = uVar8 - 1;
                iVar7 = iVar7 + -1;
              } while (iVar7 != -2);
            }
            uVar8 = -1 << ((byte)uVar6 & 0x1f);
            uVar6 = ~uVar8 + uVar10;
            iVar9 = -((int)uVar6 >> 1);
            if ((uVar6 & 1) != 0) {
              iVar9 = (int)(uVar10 - uVar8) >> 1;
            }
            (psVar1->pwt).chroma_weight_l0[lVar16][lVar17] = iVar9;
            pFVar12 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar12 = _stdout;
            }
            fprintf(pFVar12,"sh->pwt.chroma_weight_l0[ i ][ j ]: %d \n");
            pFVar12 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar12 = _stdout;
            }
            fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
            pbVar5 = b->p;
            pbVar4 = b->end;
            uVar10 = b->bits_left;
            uVar6 = 0xffffffff;
            iVar9 = -2;
            do {
              iVar7 = iVar9;
              uVar8 = uVar6;
              uVar10 = uVar10 - 1;
              b->bits_left = uVar10;
              bVar18 = true;
              if (pbVar5 < pbVar4) {
                bVar18 = (*pbVar5 >> (uVar10 & 0x1f) & 1) == 0;
              }
              if (uVar10 == 0) {
                pbVar5 = pbVar5 + 1;
                b->p = pbVar5;
                b->bits_left = 8;
                uVar10 = 8;
              }
              uVar6 = uVar8 + 1;
            } while (((bool)(bVar18 & uVar6 < 0x20)) && (iVar9 = iVar7 + 1, pbVar5 < pbVar4));
            if (uVar6 == 0) {
              uVar10 = 0;
            }
            else {
              uVar13 = b->bits_left;
              pbVar5 = b->p;
              uVar10 = 0;
              do {
                uVar13 = uVar13 - 1;
                b->bits_left = uVar13;
                uVar14 = 0;
                if (pbVar5 < pbVar4) {
                  uVar14 = (uint)((*pbVar5 >> (uVar13 & 0x1f) & 1) != 0);
                }
                if (uVar13 == 0) {
                  pbVar5 = pbVar5 + 1;
                  b->p = pbVar5;
                  b->bits_left = 8;
                  uVar13 = 8;
                }
                uVar10 = uVar10 | uVar14 << ((byte)uVar8 & 0x1f);
                uVar8 = uVar8 - 1;
                iVar7 = iVar7 + -1;
              } while (iVar7 != -2);
            }
            uVar6 = -1 << ((byte)uVar6 & 0x1f);
            uVar8 = ~uVar6 + uVar10;
            iVar9 = -((int)uVar8 >> 1);
            if ((uVar8 & 1) != 0) {
              iVar9 = (int)(uVar10 - uVar6) >> 1;
            }
            (psVar1->pwt).chroma_offset_l0[lVar16][lVar17] = iVar9;
            pFVar12 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar12 = _stdout;
            }
            fprintf(pFVar12,"sh->pwt.chroma_offset_l0[ i ][ j ]: %d \n");
            bVar18 = lVar17 == 0;
            lVar17 = lVar17 + 1;
          } while (bVar18);
        }
      }
      bVar18 = lVar16 < ppVar3->num_ref_idx_l0_active_minus1;
      lVar16 = lVar16 + 1;
    } while (bVar18);
  }
  iVar9 = psVar1->slice_type;
  iVar7 = iVar9 + -5;
  if (iVar9 < 5) {
    iVar7 = iVar9;
  }
  if ((iVar7 == 1) && (-1 < ppVar3->num_ref_idx_l1_active_minus1)) {
    lVar16 = 0;
    do {
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      uVar15 = 0;
      fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
      uVar10 = b->bits_left - 1;
      b->bits_left = uVar10;
      pbVar5 = b->p;
      if (pbVar5 < b->end) {
        uVar15 = (ulong)((*pbVar5 >> (uVar10 & 0x1f) & 1) != 0);
      }
      if (uVar10 == 0) {
        b->p = pbVar5 + 1;
        b->bits_left = 8;
      }
      (psVar1->pwt).luma_weight_l1_flag[lVar16] = (int)uVar15;
      pFVar12 = (FILE *)h264_dbgfile;
      if (h264_dbgfile == (FILE *)0x0) {
        pFVar12 = _stdout;
      }
      fprintf(pFVar12,"sh->pwt.luma_weight_l1_flag[i]: %d \n",uVar15);
      if ((psVar1->pwt).luma_weight_l1_flag[lVar16] != 0) {
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        pbVar5 = b->p;
        pbVar4 = b->end;
        uVar10 = b->bits_left;
        uVar6 = 0xffffffff;
        iVar9 = -2;
        do {
          iVar7 = iVar9;
          uVar8 = uVar6;
          uVar10 = uVar10 - 1;
          b->bits_left = uVar10;
          bVar18 = true;
          if (pbVar5 < pbVar4) {
            bVar18 = (*pbVar5 >> (uVar10 & 0x1f) & 1) == 0;
          }
          if (uVar10 == 0) {
            pbVar5 = pbVar5 + 1;
            b->p = pbVar5;
            b->bits_left = 8;
            uVar10 = 8;
          }
          uVar6 = uVar8 + 1;
        } while (((bool)(bVar18 & uVar6 < 0x20)) && (iVar9 = iVar7 + 1, pbVar5 < pbVar4));
        if (uVar6 == 0) {
          uVar10 = 0;
        }
        else {
          uVar13 = b->bits_left;
          pbVar5 = b->p;
          uVar10 = 0;
          do {
            uVar13 = uVar13 - 1;
            b->bits_left = uVar13;
            uVar14 = 0;
            if (pbVar5 < pbVar4) {
              uVar14 = (uint)((*pbVar5 >> (uVar13 & 0x1f) & 1) != 0);
            }
            if (uVar13 == 0) {
              pbVar5 = pbVar5 + 1;
              b->p = pbVar5;
              b->bits_left = 8;
              uVar13 = 8;
            }
            uVar10 = uVar10 | uVar14 << ((byte)uVar8 & 0x1f);
            uVar8 = uVar8 - 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != -2);
        }
        uVar8 = -1 << ((byte)uVar6 & 0x1f);
        uVar6 = ~uVar8 + uVar10;
        iVar9 = -((int)uVar6 >> 1);
        if ((uVar6 & 1) != 0) {
          iVar9 = (int)(uVar10 - uVar8) >> 1;
        }
        (psVar1->pwt).luma_weight_l1[lVar16] = iVar9;
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"sh->pwt.luma_weight_l1[ i ]: %d \n");
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        pbVar5 = b->p;
        pbVar4 = b->end;
        uVar10 = b->bits_left;
        uVar6 = 0xffffffff;
        iVar9 = -2;
        do {
          iVar7 = iVar9;
          uVar8 = uVar6;
          uVar10 = uVar10 - 1;
          b->bits_left = uVar10;
          bVar18 = true;
          if (pbVar5 < pbVar4) {
            bVar18 = (*pbVar5 >> (uVar10 & 0x1f) & 1) == 0;
          }
          if (uVar10 == 0) {
            pbVar5 = pbVar5 + 1;
            b->p = pbVar5;
            b->bits_left = 8;
            uVar10 = 8;
          }
          uVar6 = uVar8 + 1;
        } while (((bool)(bVar18 & uVar6 < 0x20)) && (iVar9 = iVar7 + 1, pbVar5 < pbVar4));
        if (uVar6 == 0) {
          uVar10 = 0;
        }
        else {
          uVar13 = b->bits_left;
          pbVar5 = b->p;
          uVar10 = 0;
          do {
            uVar13 = uVar13 - 1;
            b->bits_left = uVar13;
            uVar14 = 0;
            if (pbVar5 < pbVar4) {
              uVar14 = (uint)((*pbVar5 >> (uVar13 & 0x1f) & 1) != 0);
            }
            if (uVar13 == 0) {
              pbVar5 = pbVar5 + 1;
              b->p = pbVar5;
              b->bits_left = 8;
              uVar13 = 8;
            }
            uVar10 = uVar10 | uVar14 << ((byte)uVar8 & 0x1f);
            uVar8 = uVar8 - 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != -2);
        }
        uVar6 = -1 << ((byte)uVar6 & 0x1f);
        uVar8 = ~uVar6 + uVar10;
        iVar9 = -((int)uVar8 >> 1);
        if ((uVar8 & 1) != 0) {
          iVar9 = (int)(uVar10 - uVar6) >> 1;
        }
        (psVar1->pwt).luma_offset_l1[lVar16] = iVar9;
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"sh->pwt.luma_offset_l1[ i ]: %d \n");
      }
      if (psVar2->chroma_format_idc != 0) {
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        uVar15 = 0;
        fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        uVar10 = b->bits_left - 1;
        b->bits_left = uVar10;
        pbVar5 = b->p;
        if (pbVar5 < b->end) {
          uVar15 = (ulong)((*pbVar5 >> (uVar10 & 0x1f) & 1) != 0);
        }
        if (uVar10 == 0) {
          b->p = pbVar5 + 1;
          b->bits_left = 8;
        }
        (psVar1->pwt).chroma_weight_l1_flag[lVar16] = (int)uVar15;
        pFVar12 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar12 = _stdout;
        }
        fprintf(pFVar12,"sh->pwt.chroma_weight_l1_flag[i]: %d \n",uVar15);
        if ((psVar1->pwt).chroma_weight_l1_flag[lVar16] != 0) {
          lVar17 = 0;
          do {
            pFVar12 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar12 = _stdout;
            }
            fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
            pbVar5 = b->p;
            pbVar4 = b->end;
            uVar10 = b->bits_left;
            uVar6 = 0xffffffff;
            iVar9 = -2;
            do {
              iVar7 = iVar9;
              uVar8 = uVar6;
              uVar10 = uVar10 - 1;
              b->bits_left = uVar10;
              bVar18 = true;
              if (pbVar5 < pbVar4) {
                bVar18 = (*pbVar5 >> (uVar10 & 0x1f) & 1) == 0;
              }
              if (uVar10 == 0) {
                pbVar5 = pbVar5 + 1;
                b->p = pbVar5;
                b->bits_left = 8;
                uVar10 = 8;
              }
              uVar6 = uVar8 + 1;
            } while (((bool)(bVar18 & uVar6 < 0x20)) && (iVar9 = iVar7 + 1, pbVar5 < pbVar4));
            if (uVar6 == 0) {
              uVar10 = 0;
            }
            else {
              uVar13 = b->bits_left;
              pbVar5 = b->p;
              uVar10 = 0;
              do {
                uVar13 = uVar13 - 1;
                b->bits_left = uVar13;
                uVar14 = 0;
                if (pbVar5 < pbVar4) {
                  uVar14 = (uint)((*pbVar5 >> (uVar13 & 0x1f) & 1) != 0);
                }
                if (uVar13 == 0) {
                  pbVar5 = pbVar5 + 1;
                  b->p = pbVar5;
                  b->bits_left = 8;
                  uVar13 = 8;
                }
                uVar10 = uVar10 | uVar14 << ((byte)uVar8 & 0x1f);
                uVar8 = uVar8 - 1;
                iVar7 = iVar7 + -1;
              } while (iVar7 != -2);
            }
            uVar8 = -1 << ((byte)uVar6 & 0x1f);
            uVar6 = ~uVar8 + uVar10;
            iVar9 = -((int)uVar6 >> 1);
            if ((uVar6 & 1) != 0) {
              iVar9 = (int)(uVar10 - uVar8) >> 1;
            }
            (psVar1->pwt).chroma_weight_l1[lVar16][lVar17] = iVar9;
            pFVar12 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar12 = _stdout;
            }
            fprintf(pFVar12,"sh->pwt.chroma_weight_l1[ i ][ j ]: %d \n");
            pFVar12 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar12 = _stdout;
            }
            fprintf(pFVar12,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
            pbVar5 = b->p;
            pbVar4 = b->end;
            uVar10 = b->bits_left;
            uVar6 = 0xffffffff;
            iVar9 = -2;
            do {
              iVar7 = iVar9;
              uVar8 = uVar6;
              uVar10 = uVar10 - 1;
              b->bits_left = uVar10;
              bVar18 = true;
              if (pbVar5 < pbVar4) {
                bVar18 = (*pbVar5 >> (uVar10 & 0x1f) & 1) == 0;
              }
              if (uVar10 == 0) {
                pbVar5 = pbVar5 + 1;
                b->p = pbVar5;
                b->bits_left = 8;
                uVar10 = 8;
              }
              uVar6 = uVar8 + 1;
            } while (((bool)(bVar18 & uVar6 < 0x20)) && (iVar9 = iVar7 + 1, pbVar5 < pbVar4));
            if (uVar6 == 0) {
              uVar10 = 0;
            }
            else {
              uVar13 = b->bits_left;
              pbVar5 = b->p;
              uVar10 = 0;
              do {
                uVar13 = uVar13 - 1;
                b->bits_left = uVar13;
                uVar14 = 0;
                if (pbVar5 < pbVar4) {
                  uVar14 = (uint)((*pbVar5 >> (uVar13 & 0x1f) & 1) != 0);
                }
                if (uVar13 == 0) {
                  pbVar5 = pbVar5 + 1;
                  b->p = pbVar5;
                  b->bits_left = 8;
                  uVar13 = 8;
                }
                uVar10 = uVar10 | uVar14 << ((byte)uVar8 & 0x1f);
                uVar8 = uVar8 - 1;
                iVar7 = iVar7 + -1;
              } while (iVar7 != -2);
            }
            uVar6 = -1 << ((byte)uVar6 & 0x1f);
            uVar8 = ~uVar6 + uVar10;
            iVar9 = -((int)uVar8 >> 1);
            if ((uVar8 & 1) != 0) {
              iVar9 = (int)(uVar10 - uVar6) >> 1;
            }
            (psVar1->pwt).chroma_offset_l1[lVar16][lVar17] = iVar9;
            pFVar12 = (FILE *)h264_dbgfile;
            if (h264_dbgfile == (FILE *)0x0) {
              pFVar12 = _stdout;
            }
            fprintf(pFVar12,"sh->pwt.chroma_offset_l1[ i ][ j ]: %d \n");
            bVar18 = lVar17 == 0;
            lVar17 = lVar17 + 1;
          } while (bVar18);
        }
      }
      bVar18 = lVar16 < ppVar3->num_ref_idx_l1_active_minus1;
      lVar16 = lVar16 + 1;
    } while (bVar18);
  }
  return;
}

Assistant:

void read_debug_pred_weight_table(h264_stream_t* h, bs_t* b)
{
    slice_header_t* sh = h->sh;
    sps_t* sps = h->sps;
    pps_t* pps = h->pps;

    int i, j;

    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_log2_weight_denom = bs_read_ue(b); printf("sh->pwt.luma_log2_weight_denom: %d \n", sh->pwt.luma_log2_weight_denom); 
    if( sps->chroma_format_idc != 0 ) //FIXME ChromaArrayType may differ from chroma_format_idc
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_log2_weight_denom = bs_read_ue(b); printf("sh->pwt.chroma_log2_weight_denom: %d \n", sh->pwt.chroma_log2_weight_denom); 
    }
    for( i = 0; i <= pps->num_ref_idx_l0_active_minus1; i++ )
    {
        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_weight_l0_flag[i] = bs_read_u1(b); printf("sh->pwt.luma_weight_l0_flag[i]: %d \n", sh->pwt.luma_weight_l0_flag[i]); 
        if( sh->pwt.luma_weight_l0_flag[i] )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_weight_l0[ i ] = bs_read_se(b); printf("sh->pwt.luma_weight_l0[ i ]: %d \n", sh->pwt.luma_weight_l0[ i ]); 
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_offset_l0[ i ] = bs_read_se(b); printf("sh->pwt.luma_offset_l0[ i ]: %d \n", sh->pwt.luma_offset_l0[ i ]); 
        }
        if ( sps->chroma_format_idc != 0 ) //FIXME ChromaArrayType may differ from chroma_format_idc
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_weight_l0_flag[i] = bs_read_u1(b); printf("sh->pwt.chroma_weight_l0_flag[i]: %d \n", sh->pwt.chroma_weight_l0_flag[i]); 
            if( sh->pwt.chroma_weight_l0_flag[i] )
            {
                for( j =0; j < 2; j++ )
                {
                    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_weight_l0[ i ][ j ] = bs_read_se(b); printf("sh->pwt.chroma_weight_l0[ i ][ j ]: %d \n", sh->pwt.chroma_weight_l0[ i ][ j ]); 
                    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_offset_l0[ i ][ j ] = bs_read_se(b); printf("sh->pwt.chroma_offset_l0[ i ][ j ]: %d \n", sh->pwt.chroma_offset_l0[ i ][ j ]); 
                }
            }
        }
    }
    if( is_slice_type( sh->slice_type, SH_SLICE_TYPE_B ) )
    {
        for( i = 0; i <= pps->num_ref_idx_l1_active_minus1; i++ )
        {
            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_weight_l1_flag[i] = bs_read_u1(b); printf("sh->pwt.luma_weight_l1_flag[i]: %d \n", sh->pwt.luma_weight_l1_flag[i]); 
            if( sh->pwt.luma_weight_l1_flag[i] )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_weight_l1[ i ] = bs_read_se(b); printf("sh->pwt.luma_weight_l1[ i ]: %d \n", sh->pwt.luma_weight_l1[ i ]); 
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.luma_offset_l1[ i ] = bs_read_se(b); printf("sh->pwt.luma_offset_l1[ i ]: %d \n", sh->pwt.luma_offset_l1[ i ]); 
            }
            if( sps->chroma_format_idc != 0 )
            {
                printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_weight_l1_flag[i] = bs_read_u1(b); printf("sh->pwt.chroma_weight_l1_flag[i]: %d \n", sh->pwt.chroma_weight_l1_flag[i]); 
                if( sh->pwt.chroma_weight_l1_flag[i] )
                {
                    for( j = 0; j < 2; j++ )
                    {
                        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_weight_l1[ i ][ j ] = bs_read_se(b); printf("sh->pwt.chroma_weight_l1[ i ][ j ]: %d \n", sh->pwt.chroma_weight_l1[ i ][ j ]); 
                        printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); sh->pwt.chroma_offset_l1[ i ][ j ] = bs_read_se(b); printf("sh->pwt.chroma_offset_l1[ i ][ j ]: %d \n", sh->pwt.chroma_offset_l1[ i ][ j ]); 
                    }
                }
            }
        }
    }
}